

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf_reader.c
# Opt level: O0

int read_int(char **token)

{
  bool bVar1;
  ushort **ppuVar2;
  int local_1c;
  int local_14;
  int neg;
  int value;
  char **token_local;
  
  local_14 = 0;
  bVar1 = false;
  skip_spaces(token);
  if (**token == '-') {
    bVar1 = true;
    *token = *token + 1;
  }
  else if (**token == '+') {
    *token = *token + 1;
  }
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[(int)**token] & 0x800) != 0) {
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)**token] & 0x800) != 0) {
      local_14 = local_14 * 10 + **token + -0x30;
      *token = *token + 1;
    }
    if (bVar1) {
      local_1c = -local_14;
    }
    else {
      local_1c = local_14;
    }
    return local_1c;
  }
  printf("Parsing error. Unexpected char: %c.\n",(ulong)(uint)(int)**token);
  exit(1);
}

Assistant:

static int read_int(char **token)
{
    int value = 0;
    int neg = 0;

    skip_spaces(token);
    if (**token == '-') {
        neg = 1;
        (*token)++;
    } else if (**token == '+')
        (*token)++;

    if (!isdigit(**token)) {
        printf("Parsing error. Unexpected char: %c.\n", **token);
        exit(EXIT_FAILURE);
    }
    while (isdigit(**token)) {
        value = (value * 10) + (**token - '0');
        (*token)++;
    }
    return neg ? -value : value;
}